

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  Scene *pSVar7;
  Ref<embree::Geometry> *pRVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  byte bVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  undefined1 (*pauVar51) [16];
  long lVar52;
  int iVar53;
  ulong uVar54;
  long lVar55;
  long lVar56;
  uint uVar57;
  ulong uVar58;
  undefined1 (*pauVar59) [16];
  ulong uVar60;
  undefined1 (*pauVar61) [16];
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  Geometry *pGVar69;
  long lVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  undefined1 (*pauVar74) [16];
  ulong uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar77 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar113;
  float fVar118;
  float fVar119;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar133 [16];
  float fVar132;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar137 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  float fVar154;
  undefined4 uVar155;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2a20 [16];
  undefined1 (*local_2a10) [16];
  long local_2a08;
  ulong local_2a00;
  ulong local_29f8;
  long local_29f0;
  ulong local_29e8;
  ulong local_29e0;
  long local_29d8;
  ulong local_29d0;
  ulong local_29c8;
  undefined1 local_29c0 [32];
  RTCFilterFunctionNArguments local_2990;
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  float local_28c0;
  float fStack_28bc;
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  undefined4 uStack_28a4;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  RTCHitN local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 local_2740 [16];
  undefined4 local_2730;
  undefined4 uStack_272c;
  undefined4 uStack_2728;
  undefined4 uStack_2724;
  undefined1 local_2720 [16];
  uint local_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [8];
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined4 uStack_23e4;
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar51 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar155 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_2420._4_4_ = uVar155;
  local_2420._0_4_ = uVar155;
  local_2420._8_4_ = uVar155;
  local_2420._12_4_ = uVar155;
  local_2420._16_4_ = uVar155;
  local_2420._20_4_ = uVar155;
  local_2420._24_4_ = uVar155;
  local_2420._28_4_ = uVar155;
  auVar128 = ZEXT3264(local_2420);
  uVar155 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2440._4_4_ = uVar155;
  local_2440._0_4_ = uVar155;
  local_2440._8_4_ = uVar155;
  local_2440._12_4_ = uVar155;
  local_2440._16_4_ = uVar155;
  local_2440._20_4_ = uVar155;
  local_2440._24_4_ = uVar155;
  local_2440._28_4_ = uVar155;
  auVar131 = ZEXT3264(local_2440);
  uVar155 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2460._4_4_ = uVar155;
  local_2460._0_4_ = uVar155;
  local_2460._8_4_ = uVar155;
  local_2460._12_4_ = uVar155;
  local_2460._16_4_ = uVar155;
  local_2460._20_4_ = uVar155;
  local_2460._24_4_ = uVar155;
  local_2460._28_4_ = uVar155;
  auVar137 = ZEXT3264(local_2460);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar23 = fVar1 * 0.99999964;
  local_2480._4_4_ = fVar23;
  local_2480._0_4_ = fVar23;
  local_2480._8_4_ = fVar23;
  local_2480._12_4_ = fVar23;
  local_2480._16_4_ = fVar23;
  local_2480._20_4_ = fVar23;
  local_2480._24_4_ = fVar23;
  local_2480._28_4_ = fVar23;
  auVar147 = ZEXT3264(local_2480);
  fVar23 = fVar2 * 0.99999964;
  local_24a0._4_4_ = fVar23;
  local_24a0._0_4_ = fVar23;
  local_24a0._8_4_ = fVar23;
  local_24a0._12_4_ = fVar23;
  local_24a0._16_4_ = fVar23;
  local_24a0._20_4_ = fVar23;
  local_24a0._24_4_ = fVar23;
  local_24a0._28_4_ = fVar23;
  auVar150 = ZEXT3264(local_24a0);
  fVar23 = fVar3 * 0.99999964;
  local_24c0._4_4_ = fVar23;
  local_24c0._0_4_ = fVar23;
  local_24c0._8_4_ = fVar23;
  local_24c0._12_4_ = fVar23;
  local_24c0._16_4_ = fVar23;
  local_24c0._20_4_ = fVar23;
  local_24c0._24_4_ = fVar23;
  local_24c0._28_4_ = fVar23;
  auVar152 = ZEXT3264(local_24c0);
  fVar1 = fVar1 * 1.0000004;
  local_24e0._4_4_ = fVar1;
  local_24e0._0_4_ = fVar1;
  local_24e0._8_4_ = fVar1;
  local_24e0._12_4_ = fVar1;
  local_24e0._16_4_ = fVar1;
  local_24e0._20_4_ = fVar1;
  local_24e0._24_4_ = fVar1;
  local_24e0._28_4_ = fVar1;
  auVar153 = ZEXT3264(local_24e0);
  fVar2 = fVar2 * 1.0000004;
  local_2500._4_4_ = fVar2;
  local_2500._0_4_ = fVar2;
  local_2500._8_4_ = fVar2;
  local_2500._12_4_ = fVar2;
  local_2500._16_4_ = fVar2;
  local_2500._20_4_ = fVar2;
  local_2500._24_4_ = fVar2;
  local_2500._28_4_ = fVar2;
  auVar158 = ZEXT3264(local_2500);
  fVar3 = fVar3 * 1.0000004;
  local_2520._4_4_ = fVar3;
  local_2520._0_4_ = fVar3;
  local_2520._8_4_ = fVar3;
  local_2520._12_4_ = fVar3;
  local_2520._16_4_ = fVar3;
  local_2520._20_4_ = fVar3;
  local_2520._24_4_ = fVar3;
  local_2520._28_4_ = fVar3;
  auVar168 = ZEXT3264(local_2520);
  uVar68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_29c8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_29d0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar75 = local_29c8 ^ 0x20;
  iVar53 = (tray->tnear).field_0.i[k];
  local_2920._4_4_ = iVar53;
  local_2920._0_4_ = iVar53;
  local_2920._8_4_ = iVar53;
  local_2920._12_4_ = iVar53;
  local_2920._16_4_ = iVar53;
  local_2920._20_4_ = iVar53;
  local_2920._24_4_ = iVar53;
  local_2920._28_4_ = iVar53;
  auVar171 = ZEXT3264(local_2920);
  iVar53 = (tray->tfar).field_0.i[k];
  auVar81 = ZEXT3264(CONCAT428(iVar53,CONCAT424(iVar53,CONCAT420(iVar53,CONCAT416(iVar53,CONCAT412(
                                                  iVar53,CONCAT48(iVar53,CONCAT44(iVar53,iVar53)))))
                                               )));
  local_23e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_23e0._0_16_ = mm_lookupmask_ps._0_16_;
  uVar73 = local_29d0 ^ 0x20;
  local_2a10 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar103._8_4_ = 0x3f800000;
  auVar103._0_8_ = 0x3f8000003f800000;
  auVar103._12_4_ = 0x3f800000;
  auVar103._16_4_ = 0x3f800000;
  auVar103._20_4_ = 0x3f800000;
  auVar103._24_4_ = 0x3f800000;
  auVar103._28_4_ = 0x3f800000;
  auVar85._8_4_ = 0xbf800000;
  auVar85._0_8_ = 0xbf800000bf800000;
  auVar85._12_4_ = 0xbf800000;
  auVar85._16_4_ = 0xbf800000;
  auVar85._20_4_ = 0xbf800000;
  auVar85._24_4_ = 0xbf800000;
  auVar85._28_4_ = 0xbf800000;
  _local_2400 = vblendvps_avx(auVar103,auVar85,local_23e0);
LAB_005ec198:
  do {
    pauVar74 = pauVar51 + -1;
    pauVar51 = pauVar51 + -1;
    if (*(float *)(*pauVar74 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar60 = *(ulong *)*pauVar51;
      while ((uVar60 & 8) == 0) {
        uVar155 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar86._4_4_ = uVar155;
        auVar86._0_4_ = uVar155;
        auVar86._8_4_ = uVar155;
        auVar86._12_4_ = uVar155;
        auVar86._16_4_ = uVar155;
        auVar86._20_4_ = uVar155;
        auVar86._24_4_ = uVar155;
        auVar86._28_4_ = uVar155;
        uVar54 = uVar60 & 0xfffffffffffffff0;
        auVar82 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar54 + 0x100 + uVar68),auVar86,
                                  *(undefined1 (*) [32])(uVar54 + 0x40 + uVar68));
        auVar125 = auVar128._0_32_;
        auVar85 = vsubps_avx(ZEXT1632(auVar82),auVar125);
        auVar91._4_4_ = auVar147._4_4_ * auVar85._4_4_;
        auVar91._0_4_ = auVar147._0_4_ * auVar85._0_4_;
        auVar91._8_4_ = auVar147._8_4_ * auVar85._8_4_;
        auVar91._12_4_ = auVar147._12_4_ * auVar85._12_4_;
        auVar91._16_4_ = auVar147._16_4_ * auVar85._16_4_;
        auVar91._20_4_ = auVar147._20_4_ * auVar85._20_4_;
        auVar91._24_4_ = auVar147._24_4_ * auVar85._24_4_;
        auVar91._28_4_ = auVar85._28_4_;
        auVar85 = vmaxps_avx(auVar171._0_32_,auVar91);
        auVar82 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar54 + 0x100 + local_29c8),auVar86,
                                  *(undefined1 (*) [32])(uVar54 + 0x40 + local_29c8));
        auVar91 = auVar131._0_32_;
        auVar103 = vsubps_avx(ZEXT1632(auVar82),auVar91);
        auVar24._4_4_ = auVar150._4_4_ * auVar103._4_4_;
        auVar24._0_4_ = auVar150._0_4_ * auVar103._0_4_;
        auVar24._8_4_ = auVar150._8_4_ * auVar103._8_4_;
        auVar24._12_4_ = auVar150._12_4_ * auVar103._12_4_;
        auVar24._16_4_ = auVar150._16_4_ * auVar103._16_4_;
        auVar24._20_4_ = auVar150._20_4_ * auVar103._20_4_;
        auVar24._24_4_ = auVar150._24_4_ * auVar103._24_4_;
        auVar24._28_4_ = auVar103._28_4_;
        auVar82 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar54 + 0x100 + local_29d0),auVar86,
                                  *(undefined1 (*) [32])(uVar54 + 0x40 + local_29d0));
        auVar134 = auVar137._0_32_;
        auVar103 = vsubps_avx(ZEXT1632(auVar82),auVar134);
        auVar25._4_4_ = auVar152._4_4_ * auVar103._4_4_;
        auVar25._0_4_ = auVar152._0_4_ * auVar103._0_4_;
        auVar25._8_4_ = auVar152._8_4_ * auVar103._8_4_;
        auVar25._12_4_ = auVar152._12_4_ * auVar103._12_4_;
        auVar25._16_4_ = auVar152._16_4_ * auVar103._16_4_;
        auVar25._20_4_ = auVar152._20_4_ * auVar103._20_4_;
        auVar25._24_4_ = auVar152._24_4_ * auVar103._24_4_;
        auVar25._28_4_ = auVar103._28_4_;
        auVar103 = vmaxps_avx(auVar24,auVar25);
        local_26e0 = vmaxps_avx(auVar85,auVar103);
        auVar82 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar54 + 0x100 + (uVar68 ^ 0x20)),auVar86,
                                  *(undefined1 (*) [32])(uVar54 + 0x40 + (uVar68 ^ 0x20)));
        auVar85 = vsubps_avx(ZEXT1632(auVar82),auVar125);
        auVar26._4_4_ = auVar153._4_4_ * auVar85._4_4_;
        auVar26._0_4_ = auVar153._0_4_ * auVar85._0_4_;
        auVar26._8_4_ = auVar153._8_4_ * auVar85._8_4_;
        auVar26._12_4_ = auVar153._12_4_ * auVar85._12_4_;
        auVar26._16_4_ = auVar153._16_4_ * auVar85._16_4_;
        auVar26._20_4_ = auVar153._20_4_ * auVar85._20_4_;
        auVar26._24_4_ = auVar153._24_4_ * auVar85._24_4_;
        auVar26._28_4_ = auVar85._28_4_;
        auVar82 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar54 + 0x100 + uVar75),auVar86,
                                  *(undefined1 (*) [32])(uVar54 + 0x40 + uVar75));
        auVar85 = vsubps_avx(ZEXT1632(auVar82),auVar91);
        auVar27._4_4_ = auVar158._4_4_ * auVar85._4_4_;
        auVar27._0_4_ = auVar158._0_4_ * auVar85._0_4_;
        auVar27._8_4_ = auVar158._8_4_ * auVar85._8_4_;
        auVar27._12_4_ = auVar158._12_4_ * auVar85._12_4_;
        auVar27._16_4_ = auVar158._16_4_ * auVar85._16_4_;
        auVar27._20_4_ = auVar158._20_4_ * auVar85._20_4_;
        auVar27._24_4_ = auVar158._24_4_ * auVar85._24_4_;
        auVar27._28_4_ = auVar85._28_4_;
        auVar82 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar54 + 0x100 + uVar73),auVar86,
                                  *(undefined1 (*) [32])(uVar54 + 0x40 + uVar73));
        auVar85 = vsubps_avx(ZEXT1632(auVar82),auVar134);
        auVar28._4_4_ = auVar168._4_4_ * auVar85._4_4_;
        auVar28._0_4_ = auVar168._0_4_ * auVar85._0_4_;
        auVar28._8_4_ = auVar168._8_4_ * auVar85._8_4_;
        auVar28._12_4_ = auVar168._12_4_ * auVar85._12_4_;
        auVar28._16_4_ = auVar168._16_4_ * auVar85._16_4_;
        auVar28._20_4_ = auVar168._20_4_ * auVar85._20_4_;
        auVar28._24_4_ = auVar168._24_4_ * auVar85._24_4_;
        auVar28._28_4_ = auVar85._28_4_;
        auVar85 = vminps_avx(auVar27,auVar28);
        auVar103 = vminps_avx(auVar81._0_32_,auVar26);
        auVar85 = vminps_avx(auVar103,auVar85);
        auVar85 = vcmpps_avx(local_26e0,auVar85,2);
        if (((uint)uVar60 & 7) == 6) {
          auVar103 = vcmpps_avx(*(undefined1 (*) [32])(uVar54 + 0x1c0),auVar86,2);
          auVar24 = vcmpps_avx(auVar86,*(undefined1 (*) [32])(uVar54 + 0x1e0),1);
          auVar103 = vandps_avx(auVar103,auVar24);
          auVar85 = vandps_avx(auVar103,auVar85);
          auVar82 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
        }
        else {
          auVar82 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
        }
        auVar82 = vpsllw_avx(auVar82,0xf);
        if ((((((((auVar82 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar82 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar82 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar82 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar82 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar82 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar82 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar82[0xf]
           ) {
          if (pauVar51 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005ec198;
        }
        auVar82 = vpacksswb_avx(auVar82,auVar82);
        bVar32 = SUB161(auVar82 >> 7,0) & 1 | (SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar82 >> 0x17,0) & 1) << 2 | (SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar82 >> 0x27,0) & 1) << 4 | (SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar82 >> 0x37,0) & 1) << 6 | SUB161(auVar82 >> 0x3f,0) << 7;
        lVar55 = 0;
        for (uVar60 = (ulong)bVar32; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
          lVar55 = lVar55 + 1;
        }
        uVar60 = *(ulong *)(uVar54 + lVar55 * 8);
        uVar57 = bVar32 - 1 & (uint)bVar32;
        uVar58 = (ulong)uVar57;
        if (uVar57 != 0) {
          uVar50 = *(uint *)(local_26e0 + lVar55 * 4);
          lVar55 = 0;
          for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
            lVar55 = lVar55 + 1;
          }
          uVar57 = uVar57 - 1 & uVar57;
          uVar62 = (ulong)uVar57;
          uVar58 = *(ulong *)(uVar54 + lVar55 * 8);
          uVar6 = *(uint *)(local_26e0 + lVar55 * 4);
          if (uVar57 == 0) {
            if (uVar50 < uVar6) {
              *(ulong *)*pauVar51 = uVar58;
              *(uint *)(*pauVar51 + 8) = uVar6;
              pauVar51 = pauVar51 + 1;
            }
            else {
              *(ulong *)*pauVar51 = uVar60;
              *(uint *)(*pauVar51 + 8) = uVar50;
              pauVar51 = pauVar51 + 1;
              uVar60 = uVar58;
            }
          }
          else {
            auVar82._8_8_ = 0;
            auVar82._0_8_ = uVar60;
            auVar82 = vpunpcklqdq_avx(auVar82,ZEXT416(uVar50));
            auVar93._8_8_ = 0;
            auVar93._0_8_ = uVar58;
            auVar93 = vpunpcklqdq_avx(auVar93,ZEXT416(uVar6));
            lVar55 = 0;
            for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
              lVar55 = lVar55 + 1;
            }
            uVar57 = uVar57 - 1 & uVar57;
            uVar60 = (ulong)uVar57;
            auVar100._8_8_ = 0;
            auVar100._0_8_ = *(ulong *)(uVar54 + lVar55 * 8);
            auVar83 = vpunpcklqdq_avx(auVar100,ZEXT416(*(uint *)(local_26e0 + lVar55 * 4)));
            auVar100 = vpcmpgtd_avx(auVar93,auVar82);
            if (uVar57 == 0) {
              auVar114 = vpshufd_avx(auVar100,0xaa);
              auVar100 = vblendvps_avx(auVar93,auVar82,auVar114);
              auVar82 = vblendvps_avx(auVar82,auVar93,auVar114);
              auVar93 = vpcmpgtd_avx(auVar83,auVar100);
              auVar114 = vpshufd_avx(auVar93,0xaa);
              auVar93 = vblendvps_avx(auVar83,auVar100,auVar114);
              auVar100 = vblendvps_avx(auVar100,auVar83,auVar114);
              auVar83 = vpcmpgtd_avx(auVar100,auVar82);
              auVar114 = vpshufd_avx(auVar83,0xaa);
              auVar83 = vblendvps_avx(auVar100,auVar82,auVar114);
              auVar82 = vblendvps_avx(auVar82,auVar100,auVar114);
              *pauVar51 = auVar82;
              pauVar51[1] = auVar83;
              uVar60 = auVar93._0_8_;
              pauVar51 = pauVar51 + 2;
            }
            else {
              lVar55 = 0;
              for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                lVar55 = lVar55 + 1;
              }
              uVar57 = uVar57 - 1 & uVar57;
              uVar58 = (ulong)uVar57;
              auVar114._8_8_ = 0;
              auVar114._0_8_ = *(ulong *)(uVar54 + lVar55 * 8);
              auVar114 = vpunpcklqdq_avx(auVar114,ZEXT416(*(uint *)(local_26e0 + lVar55 * 4)));
              if (uVar57 == 0) {
                auVar94 = vpshufd_avx(auVar100,0xaa);
                auVar100 = vblendvps_avx(auVar93,auVar82,auVar94);
                auVar82 = vblendvps_avx(auVar82,auVar93,auVar94);
                auVar93 = vpcmpgtd_avx(auVar114,auVar83);
                auVar94 = vpshufd_avx(auVar93,0xaa);
                auVar93 = vblendvps_avx(auVar114,auVar83,auVar94);
                auVar83 = vblendvps_avx(auVar83,auVar114,auVar94);
                auVar114 = vpcmpgtd_avx(auVar83,auVar82);
                auVar94 = vpshufd_avx(auVar114,0xaa);
                auVar114 = vblendvps_avx(auVar83,auVar82,auVar94);
                auVar82 = vblendvps_avx(auVar82,auVar83,auVar94);
                auVar83 = vpcmpgtd_avx(auVar93,auVar100);
                auVar94 = vpshufd_avx(auVar83,0xaa);
                auVar83 = vblendvps_avx(auVar93,auVar100,auVar94);
                auVar93 = vblendvps_avx(auVar100,auVar93,auVar94);
                auVar100 = vpcmpgtd_avx(auVar114,auVar93);
                auVar94 = vpshufd_avx(auVar100,0xaa);
                auVar100 = vblendvps_avx(auVar114,auVar93,auVar94);
                auVar93 = vblendvps_avx(auVar93,auVar114,auVar94);
                *pauVar51 = auVar82;
                pauVar51[1] = auVar93;
                pauVar51[2] = auVar100;
                uVar60 = auVar83._0_8_;
                pauVar74 = pauVar51 + 3;
              }
              else {
                *pauVar51 = auVar82;
                pauVar51[1] = auVar93;
                pauVar51[2] = auVar83;
                pauVar51[3] = auVar114;
                lVar55 = 0x30;
                do {
                  lVar52 = lVar55;
                  lVar55 = 0;
                  for (uVar60 = uVar58; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000
                      ) {
                    lVar55 = lVar55 + 1;
                  }
                  uVar60 = *(ulong *)(uVar54 + lVar55 * 8);
                  auVar83._8_8_ = 0;
                  auVar83._0_8_ = uVar60;
                  auVar82 = vpunpcklqdq_avx(auVar83,ZEXT416(*(uint *)(local_26e0 + lVar55 * 4)));
                  *(undefined1 (*) [16])(pauVar51[1] + lVar52) = auVar82;
                  uVar58 = uVar58 - 1 & uVar58;
                  lVar55 = lVar52 + 0x10;
                } while (uVar58 != 0);
                pauVar74 = (undefined1 (*) [16])(pauVar51[1] + lVar52);
                if (lVar52 + 0x10 != 0) {
                  lVar55 = 0x10;
                  pauVar59 = pauVar51;
                  do {
                    auVar82 = pauVar59[1];
                    pauVar59 = pauVar59 + 1;
                    uVar57 = vextractps_avx(auVar82,2);
                    lVar52 = lVar55;
                    do {
                      if (uVar57 <= *(uint *)(pauVar51[-1] + lVar52 + 8)) {
                        pauVar61 = (undefined1 (*) [16])(*pauVar51 + lVar52);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar51 + lVar52) =
                           *(undefined1 (*) [16])(pauVar51[-1] + lVar52);
                      lVar52 = lVar52 + -0x10;
                      pauVar61 = pauVar51;
                    } while (lVar52 != 0);
                    *pauVar61 = auVar82;
                    lVar55 = lVar55 + 0x10;
                  } while (pauVar74 != pauVar59);
                  uVar60 = *(ulong *)*pauVar74;
                }
              }
              auVar128 = ZEXT3264(auVar125);
              auVar131 = ZEXT3264(auVar91);
              auVar137 = ZEXT3264(auVar134);
              auVar147 = ZEXT3264(auVar147._0_32_);
              auVar150 = ZEXT3264(auVar150._0_32_);
              auVar152 = ZEXT3264(auVar152._0_32_);
              auVar153 = ZEXT3264(auVar153._0_32_);
              auVar158 = ZEXT3264(auVar158._0_32_);
              auVar168 = ZEXT3264(auVar168._0_32_);
              auVar171 = ZEXT3264(local_2920);
              pauVar51 = pauVar74;
            }
          }
        }
      }
      local_2a08 = (ulong)((uint)uVar60 & 0xf) - 8;
      if (local_2a08 != 0) {
        uVar60 = uVar60 & 0xfffffffffffffff0;
        local_29d8 = 0;
        do {
          lVar52 = local_29d8 * 0x60;
          pSVar7 = context->scene;
          pRVar8 = (pSVar7->geometries).items;
          pGVar69 = pRVar8[*(uint *)(uVar60 + 0x40 + lVar52)].ptr;
          fVar1 = (pGVar69->time_range).lower;
          fVar1 = pGVar69->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar69->time_range).upper - fVar1))
          ;
          auVar82 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
          auVar82 = vminss_avx(auVar82,ZEXT416((uint)(pGVar69->fnumTimeSegments + -1.0)));
          auVar115 = vmaxss_avx(ZEXT816(0) << 0x20,auVar82);
          iVar53 = (int)auVar115._0_4_;
          lVar70 = (long)iVar53 * 0x38;
          lVar55 = *(long *)(*(long *)&pGVar69[2].numPrimitives + lVar70);
          uVar57 = *(uint *)(uVar60 + 4 + lVar52);
          auVar82 = *(undefined1 (*) [16])(lVar55 + (ulong)*(uint *)(uVar60 + lVar52) * 4);
          uVar58 = (ulong)*(uint *)(uVar60 + 0x10 + lVar52);
          auVar93 = *(undefined1 (*) [16])(lVar55 + uVar58 * 4);
          uVar62 = (ulong)*(uint *)(uVar60 + 0x20 + lVar52);
          auVar100 = *(undefined1 (*) [16])(lVar55 + uVar62 * 4);
          uVar63 = (ulong)*(uint *)(uVar60 + 0x30 + lVar52);
          auVar83 = *(undefined1 (*) [16])(lVar55 + uVar63 * 4);
          local_29f0 = *(long *)&pRVar8[*(uint *)(uVar60 + 0x44 + lVar52)].ptr[2].numPrimitives;
          lVar55 = *(long *)(local_29f0 + lVar70);
          auVar114 = *(undefined1 (*) [16])(lVar55 + (ulong)uVar57 * 4);
          uVar64 = (ulong)*(uint *)(uVar60 + 0x14 + lVar52);
          auVar94 = *(undefined1 (*) [16])(lVar55 + uVar64 * 4);
          uVar65 = (ulong)*(uint *)(uVar60 + 0x24 + lVar52);
          auVar102 = *(undefined1 (*) [16])(lVar55 + uVar65 * 4);
          uVar66 = (ulong)*(uint *)(uVar60 + 0x34 + lVar52);
          auVar76 = *(undefined1 (*) [16])(lVar55 + uVar66 * 4);
          lVar55 = *(long *)&pRVar8[*(uint *)(uVar60 + 0x48 + lVar52)].ptr[2].numPrimitives;
          lVar9 = *(long *)(lVar55 + lVar70);
          uVar67 = (ulong)*(uint *)(uVar60 + 8 + lVar52);
          auVar101 = *(undefined1 (*) [16])(lVar9 + uVar67 * 4);
          local_29e8 = (ulong)*(uint *)(uVar60 + 0x18 + lVar52);
          auVar169 = *(undefined1 (*) [16])(lVar9 + local_29e8 * 4);
          local_29e0 = (ulong)*(uint *)(uVar60 + 0x28 + lVar52);
          auVar77 = *(undefined1 (*) [16])(lVar9 + local_29e0 * 4);
          uVar72 = (ulong)*(uint *)(uVar60 + 0x38 + lVar52);
          auVar5 = *(undefined1 (*) [16])(lVar9 + uVar72 * 4);
          fVar1 = fVar1 - auVar115._0_4_;
          lVar9 = *(long *)&pRVar8[*(uint *)(uVar60 + 0x4c + lVar52)].ptr[2].numPrimitives;
          lVar70 = *(long *)(lVar9 + lVar70);
          uVar54 = (ulong)*(uint *)(uVar60 + 0xc + lVar52);
          auVar115 = *(undefined1 (*) [16])(lVar70 + uVar54 * 4);
          local_2a00 = (ulong)*(uint *)(uVar60 + 0x1c + lVar52);
          auVar129 = *(undefined1 (*) [16])(lVar70 + local_2a00 * 4);
          auVar133 = vunpcklps_avx(auVar82,auVar101);
          auVar101 = vunpckhps_avx(auVar82,auVar101);
          auVar144 = vunpcklps_avx(auVar114,auVar115);
          auVar114 = vunpckhps_avx(auVar114,auVar115);
          uVar71 = (ulong)*(uint *)(uVar60 + 0x2c + lVar52);
          auVar82 = *(undefined1 (*) [16])(lVar70 + uVar71 * 4);
          auVar115 = vunpcklps_avx(auVar101,auVar114);
          local_27b0 = vunpcklps_avx(auVar133,auVar144);
          auVar114 = vunpckhps_avx(auVar133,auVar144);
          auVar133 = vunpcklps_avx(auVar93,auVar169);
          auVar101 = vunpckhps_avx(auVar93,auVar169);
          auVar169 = vunpcklps_avx(auVar94,auVar129);
          auVar94 = vunpckhps_avx(auVar94,auVar129);
          local_29f8 = (ulong)*(uint *)(uVar60 + 0x3c + lVar52);
          auVar93 = *(undefined1 (*) [16])(lVar70 + local_29f8 * 4);
          auVar101 = vunpcklps_avx(auVar101,auVar94);
          auVar129 = vunpcklps_avx(auVar133,auVar169);
          auVar94 = vunpckhps_avx(auVar133,auVar169);
          auVar169 = vunpcklps_avx(auVar100,auVar77);
          auVar100 = vunpckhps_avx(auVar100,auVar77);
          auVar77 = vunpcklps_avx(auVar102,auVar82);
          auVar102 = vunpckhps_avx(auVar102,auVar82);
          lVar56 = (long)(iVar53 + 1) * 0x38;
          lVar70 = *(long *)(*(long *)&pGVar69[2].numPrimitives + lVar56);
          auVar82 = *(undefined1 (*) [16])(lVar70 + (ulong)*(uint *)(uVar60 + lVar52) * 4);
          auVar133 = vunpcklps_avx(auVar100,auVar102);
          auVar144 = vunpcklps_avx(auVar169,auVar77);
          local_27e0 = vunpckhps_avx(auVar169,auVar77);
          auVar102 = vunpcklps_avx(auVar83,auVar5);
          auVar100 = vunpckhps_avx(auVar83,auVar5);
          auVar169 = vunpcklps_avx(auVar76,auVar93);
          auVar83 = vunpckhps_avx(auVar76,auVar93);
          lVar55 = *(long *)(lVar55 + lVar56);
          auVar93 = *(undefined1 (*) [16])(lVar55 + uVar67 * 4);
          auVar77 = vunpcklps_avx(auVar100,auVar83);
          local_27c0 = vunpcklps_avx(auVar102,auVar169);
          local_27d0 = vunpckhps_avx(auVar102,auVar169);
          lVar10 = *(long *)(local_29f0 + lVar56);
          auVar83 = vunpcklps_avx(auVar82,auVar93);
          auVar100 = vunpckhps_avx(auVar82,auVar93);
          auVar82 = *(undefined1 (*) [16])(lVar10 + (ulong)uVar57 * 4);
          lVar9 = *(long *)(lVar9 + lVar56);
          auVar93 = *(undefined1 (*) [16])(lVar9 + uVar54 * 4);
          auVar102 = vunpcklps_avx(auVar82,auVar93);
          auVar82 = vunpckhps_avx(auVar82,auVar93);
          auVar169 = vunpcklps_avx(auVar100,auVar82);
          auVar5 = vunpcklps_avx(auVar83,auVar102);
          auVar100 = vunpckhps_avx(auVar83,auVar102);
          auVar82 = *(undefined1 (*) [16])(lVar70 + uVar58 * 4);
          auVar93 = *(undefined1 (*) [16])(lVar55 + local_29e8 * 4);
          auVar102 = vunpcklps_avx(auVar82,auVar93);
          auVar83 = vunpckhps_avx(auVar82,auVar93);
          auVar82 = *(undefined1 (*) [16])(lVar10 + uVar64 * 4);
          auVar93 = *(undefined1 (*) [16])(lVar9 + local_2a00 * 4);
          auVar76 = vunpcklps_avx(auVar82,auVar93);
          auVar82 = vunpckhps_avx(auVar82,auVar93);
          auVar148 = vunpcklps_avx(auVar83,auVar82);
          auVar29 = vunpcklps_avx(auVar102,auVar76);
          auVar83 = vunpckhps_avx(auVar102,auVar76);
          auVar82 = *(undefined1 (*) [16])(lVar70 + uVar62 * 4);
          auVar93 = *(undefined1 (*) [16])(lVar55 + local_29e0 * 4);
          auVar76 = vunpcklps_avx(auVar82,auVar93);
          auVar102 = vunpckhps_avx(auVar82,auVar93);
          auVar82 = *(undefined1 (*) [16])(lVar10 + uVar65 * 4);
          auVar93 = *(undefined1 (*) [16])(lVar9 + uVar71 * 4);
          auVar84 = vunpcklps_avx(auVar82,auVar93);
          auVar82 = vunpckhps_avx(auVar82,auVar93);
          auVar30 = vunpcklps_avx(auVar102,auVar82);
          auVar31 = vunpcklps_avx(auVar76,auVar84);
          auVar102 = vunpckhps_avx(auVar76,auVar84);
          auVar82 = *(undefined1 (*) [16])(lVar70 + uVar63 * 4);
          auVar93 = *(undefined1 (*) [16])(lVar55 + uVar72 * 4);
          auVar84 = vunpcklps_avx(auVar82,auVar93);
          auVar76 = vunpckhps_avx(auVar82,auVar93);
          auVar82 = *(undefined1 (*) [16])(lVar10 + uVar66 * 4);
          auVar93 = *(undefined1 (*) [16])(lVar9 + local_29f8 * 4);
          auVar107 = vunpcklps_avx(auVar82,auVar93);
          auVar82 = vunpckhps_avx(auVar82,auVar93);
          auVar93 = vunpcklps_avx(auVar76,auVar82);
          auVar76 = vunpcklps_avx(auVar84,auVar107);
          auVar82 = vunpckhps_avx(auVar84,auVar107);
          fVar2 = 1.0 - fVar1;
          auVar165._4_4_ = fVar2;
          auVar165._0_4_ = fVar2;
          auVar165._8_4_ = fVar2;
          auVar165._12_4_ = fVar2;
          auVar84._0_4_ = fVar1 * auVar5._0_4_;
          auVar84._4_4_ = fVar1 * auVar5._4_4_;
          auVar84._8_4_ = fVar1 * auVar5._8_4_;
          auVar84._12_4_ = fVar1 * auVar5._12_4_;
          auVar5 = vfmadd231ps_fma(auVar84,auVar165,local_27b0);
          auVar124._0_4_ = fVar1 * auVar100._0_4_;
          auVar124._4_4_ = fVar1 * auVar100._4_4_;
          auVar124._8_4_ = fVar1 * auVar100._8_4_;
          auVar124._12_4_ = fVar1 * auVar100._12_4_;
          auVar100 = vfmadd231ps_fma(auVar124,auVar165,auVar114);
          auVar107._0_4_ = auVar169._0_4_ * fVar1;
          auVar107._4_4_ = auVar169._4_4_ * fVar1;
          auVar107._8_4_ = auVar169._8_4_ * fVar1;
          auVar107._12_4_ = auVar169._12_4_ * fVar1;
          auVar114 = vfmadd231ps_fma(auVar107,auVar165,auVar115);
          auVar169._0_4_ = fVar1 * auVar29._0_4_;
          auVar169._4_4_ = fVar1 * auVar29._4_4_;
          auVar169._8_4_ = fVar1 * auVar29._8_4_;
          auVar169._12_4_ = fVar1 * auVar29._12_4_;
          auVar169 = vfmadd231ps_fma(auVar169,auVar165,auVar129);
          auVar115._0_4_ = fVar1 * auVar83._0_4_;
          auVar115._4_4_ = fVar1 * auVar83._4_4_;
          auVar115._8_4_ = fVar1 * auVar83._8_4_;
          auVar115._12_4_ = fVar1 * auVar83._12_4_;
          auVar83 = vfmadd231ps_fma(auVar115,auVar165,auVar94);
          auVar94._0_4_ = auVar148._0_4_ * fVar1;
          auVar94._4_4_ = auVar148._4_4_ * fVar1;
          auVar94._8_4_ = auVar148._8_4_ * fVar1;
          auVar94._12_4_ = auVar148._12_4_ * fVar1;
          auVar94 = vfmadd231ps_fma(auVar94,auVar165,auVar101);
          auVar101._0_4_ = fVar1 * auVar31._0_4_;
          auVar101._4_4_ = fVar1 * auVar31._4_4_;
          auVar101._8_4_ = fVar1 * auVar31._8_4_;
          auVar101._12_4_ = fVar1 * auVar31._12_4_;
          auVar101 = vfmadd231ps_fma(auVar101,auVar165,auVar144);
          auVar144._0_4_ = auVar102._0_4_ * fVar1;
          auVar144._4_4_ = auVar102._4_4_ * fVar1;
          auVar144._8_4_ = auVar102._8_4_ * fVar1;
          auVar144._12_4_ = auVar102._12_4_ * fVar1;
          auVar102 = vfmadd231ps_fma(auVar144,auVar165,local_27e0);
          auVar148._0_4_ = auVar30._0_4_ * fVar1;
          auVar148._4_4_ = auVar30._4_4_ * fVar1;
          auVar148._8_4_ = auVar30._8_4_ * fVar1;
          auVar148._12_4_ = auVar30._12_4_ * fVar1;
          auVar115 = vfmadd231ps_fma(auVar148,auVar165,auVar133);
          auVar129._0_4_ = fVar1 * auVar76._0_4_;
          auVar129._4_4_ = fVar1 * auVar76._4_4_;
          auVar129._8_4_ = fVar1 * auVar76._8_4_;
          auVar129._12_4_ = fVar1 * auVar76._12_4_;
          auVar133._0_4_ = auVar82._0_4_ * fVar1;
          auVar133._4_4_ = auVar82._4_4_ * fVar1;
          auVar133._8_4_ = auVar82._8_4_ * fVar1;
          auVar133._12_4_ = auVar82._12_4_ * fVar1;
          lVar55 = uVar60 + 0x40 + lVar52;
          local_23c0 = *(undefined8 *)(lVar55 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar55 + 0x18);
          auVar76._0_4_ = auVar93._0_4_ * fVar1;
          auVar76._4_4_ = auVar93._4_4_ * fVar1;
          auVar76._8_4_ = auVar93._8_4_ * fVar1;
          auVar76._12_4_ = auVar93._12_4_ * fVar1;
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          lVar52 = uVar60 + 0x50 + lVar52;
          local_27a0 = *(undefined8 *)(lVar52 + 0x10);
          uStack_2798 = *(undefined8 *)(lVar52 + 0x18);
          auVar82 = vfmadd231ps_fma(auVar129,auVar165,local_27c0);
          auVar93 = vfmadd231ps_fma(auVar133,auVar165,local_27d0);
          auVar76 = vfmadd231ps_fma(auVar76,auVar165,auVar77);
          uStack_2790 = local_27a0;
          uStack_2788 = uStack_2798;
          auVar87._16_16_ = auVar101;
          auVar87._0_16_ = auVar5;
          auVar104._16_16_ = auVar102;
          auVar104._0_16_ = auVar100;
          auVar108._16_16_ = auVar115;
          auVar108._0_16_ = auVar114;
          auVar145._16_16_ = auVar169;
          auVar145._0_16_ = auVar169;
          auVar116._16_16_ = auVar83;
          auVar116._0_16_ = auVar83;
          auVar95._16_16_ = auVar94;
          auVar95._0_16_ = auVar94;
          auVar170._16_16_ = auVar82;
          auVar170._0_16_ = auVar82;
          auVar135._16_16_ = auVar93;
          auVar135._0_16_ = auVar93;
          uVar155 = *(undefined4 *)(ray + k * 4);
          auVar151._4_4_ = uVar155;
          auVar151._0_4_ = uVar155;
          auVar151._8_4_ = uVar155;
          auVar151._12_4_ = uVar155;
          auVar151._16_4_ = uVar155;
          auVar151._20_4_ = uVar155;
          auVar151._24_4_ = uVar155;
          auVar151._28_4_ = uVar155;
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar156._4_4_ = uVar155;
          auVar156._0_4_ = uVar155;
          auVar156._8_4_ = uVar155;
          auVar156._12_4_ = uVar155;
          auVar156._16_4_ = uVar155;
          auVar156._20_4_ = uVar155;
          auVar156._24_4_ = uVar155;
          auVar156._28_4_ = uVar155;
          auVar78._16_16_ = auVar76;
          auVar78._0_16_ = auVar76;
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar166._4_4_ = uVar4;
          auVar166._0_4_ = uVar4;
          auVar166._8_4_ = uVar4;
          auVar166._12_4_ = uVar4;
          auVar166._16_4_ = uVar4;
          auVar166._20_4_ = uVar4;
          auVar166._24_4_ = uVar4;
          auVar166._28_4_ = uVar4;
          local_29c0 = vsubps_avx(auVar87,auVar151);
          local_2960 = vsubps_avx(auVar104,auVar156);
          local_2800 = vsubps_avx(auVar108,auVar166);
          auVar85 = vsubps_avx(auVar145,auVar151);
          auVar103 = vsubps_avx(auVar116,auVar156);
          auVar91 = vsubps_avx(auVar95,auVar166);
          auVar24 = vsubps_avx(auVar170,auVar151);
          auVar25 = vsubps_avx(auVar135,auVar156);
          auVar26 = vsubps_avx(auVar78,auVar166);
          local_2820 = vsubps_avx(auVar24,local_29c0);
          local_2860 = vsubps_avx(auVar25,local_2960);
          local_2840 = vsubps_avx(auVar26,local_2800);
          auVar79._0_4_ = local_29c0._0_4_ + auVar24._0_4_;
          auVar79._4_4_ = local_29c0._4_4_ + auVar24._4_4_;
          auVar79._8_4_ = local_29c0._8_4_ + auVar24._8_4_;
          auVar79._12_4_ = local_29c0._12_4_ + auVar24._12_4_;
          auVar79._16_4_ = local_29c0._16_4_ + auVar24._16_4_;
          auVar79._20_4_ = local_29c0._20_4_ + auVar24._20_4_;
          auVar79._24_4_ = local_29c0._24_4_ + auVar24._24_4_;
          auVar79._28_4_ = local_29c0._28_4_ + auVar24._28_4_;
          auVar96._0_4_ = auVar25._0_4_ + local_2960._0_4_;
          auVar96._4_4_ = auVar25._4_4_ + local_2960._4_4_;
          auVar96._8_4_ = auVar25._8_4_ + local_2960._8_4_;
          auVar96._12_4_ = auVar25._12_4_ + local_2960._12_4_;
          auVar96._16_4_ = auVar25._16_4_ + local_2960._16_4_;
          auVar96._20_4_ = auVar25._20_4_ + local_2960._20_4_;
          auVar96._24_4_ = auVar25._24_4_ + local_2960._24_4_;
          fVar113 = local_2960._28_4_;
          auVar96._28_4_ = auVar25._28_4_ + fVar113;
          fVar2 = local_2800._0_4_;
          auVar109._0_4_ = auVar26._0_4_ + fVar2;
          fVar3 = local_2800._4_4_;
          auVar109._4_4_ = auVar26._4_4_ + fVar3;
          fVar23 = local_2800._8_4_;
          auVar109._8_4_ = auVar26._8_4_ + fVar23;
          fVar12 = local_2800._12_4_;
          auVar109._12_4_ = auVar26._12_4_ + fVar12;
          fVar13 = local_2800._16_4_;
          auVar109._16_4_ = auVar26._16_4_ + fVar13;
          fVar14 = local_2800._20_4_;
          auVar109._20_4_ = auVar26._20_4_ + fVar14;
          fVar15 = local_2800._24_4_;
          auVar109._24_4_ = auVar26._24_4_ + fVar15;
          auVar109._28_4_ = auVar26._28_4_ + local_2800._28_4_;
          auVar125._4_4_ = local_2840._4_4_ * auVar96._4_4_;
          auVar125._0_4_ = local_2840._0_4_ * auVar96._0_4_;
          auVar125._8_4_ = local_2840._8_4_ * auVar96._8_4_;
          auVar125._12_4_ = local_2840._12_4_ * auVar96._12_4_;
          auVar125._16_4_ = local_2840._16_4_ * auVar96._16_4_;
          auVar125._20_4_ = local_2840._20_4_ * auVar96._20_4_;
          auVar125._24_4_ = local_2840._24_4_ * auVar96._24_4_;
          auVar125._28_4_ = uVar155;
          auVar93 = vfmsub231ps_fma(auVar125,local_2860,auVar109);
          auVar134._4_4_ = local_2820._4_4_ * auVar109._4_4_;
          auVar134._0_4_ = local_2820._0_4_ * auVar109._0_4_;
          auVar134._8_4_ = local_2820._8_4_ * auVar109._8_4_;
          auVar134._12_4_ = local_2820._12_4_ * auVar109._12_4_;
          auVar134._16_4_ = local_2820._16_4_ * auVar109._16_4_;
          auVar134._20_4_ = local_2820._20_4_ * auVar109._20_4_;
          auVar134._24_4_ = local_2820._24_4_ * auVar109._24_4_;
          auVar134._28_4_ = auVar109._28_4_;
          auVar82 = vfmsub231ps_fma(auVar134,local_2840,auVar79);
          auVar33._4_4_ = local_2860._4_4_ * auVar79._4_4_;
          auVar33._0_4_ = local_2860._0_4_ * auVar79._0_4_;
          auVar33._8_4_ = local_2860._8_4_ * auVar79._8_4_;
          auVar33._12_4_ = local_2860._12_4_ * auVar79._12_4_;
          auVar33._16_4_ = local_2860._16_4_ * auVar79._16_4_;
          auVar33._20_4_ = local_2860._20_4_ * auVar79._20_4_;
          auVar33._24_4_ = local_2860._24_4_ * auVar79._24_4_;
          auVar33._28_4_ = auVar79._28_4_;
          auVar100 = vfmsub231ps_fma(auVar33,local_2820,auVar96);
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar167._4_4_ = uVar155;
          auVar167._0_4_ = uVar155;
          auVar167._8_4_ = uVar155;
          auVar167._12_4_ = uVar155;
          auVar167._16_4_ = uVar155;
          auVar167._20_4_ = uVar155;
          auVar167._24_4_ = uVar155;
          auVar167._28_4_ = uVar155;
          fVar1 = *(float *)(ray + k * 4 + 0x60);
          auVar34._4_4_ = fVar1 * auVar100._4_4_;
          auVar34._0_4_ = fVar1 * auVar100._0_4_;
          auVar34._8_4_ = fVar1 * auVar100._8_4_;
          auVar34._12_4_ = fVar1 * auVar100._12_4_;
          auVar34._16_4_ = fVar1 * 0.0;
          auVar34._20_4_ = fVar1 * 0.0;
          auVar34._24_4_ = fVar1 * 0.0;
          auVar34._28_4_ = local_2840._28_4_;
          auVar82 = vfmadd231ps_fma(auVar34,auVar167,ZEXT1632(auVar82));
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar130._4_4_ = uVar155;
          auVar130._0_4_ = uVar155;
          auVar130._8_4_ = uVar155;
          auVar130._12_4_ = uVar155;
          auVar130._16_4_ = uVar155;
          auVar130._20_4_ = uVar155;
          auVar130._24_4_ = uVar155;
          auVar130._28_4_ = uVar155;
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar130,ZEXT1632(auVar93));
          local_2880 = vsubps_avx(local_2960,auVar103);
          local_28a0 = vsubps_avx(local_2800,auVar91);
          auVar97._0_4_ = auVar103._0_4_ + local_2960._0_4_;
          auVar97._4_4_ = auVar103._4_4_ + local_2960._4_4_;
          auVar97._8_4_ = auVar103._8_4_ + local_2960._8_4_;
          auVar97._12_4_ = auVar103._12_4_ + local_2960._12_4_;
          auVar97._16_4_ = auVar103._16_4_ + local_2960._16_4_;
          auVar97._20_4_ = auVar103._20_4_ + local_2960._20_4_;
          auVar97._24_4_ = auVar103._24_4_ + local_2960._24_4_;
          auVar97._28_4_ = auVar103._28_4_ + fVar113;
          auVar110._0_4_ = fVar2 + auVar91._0_4_;
          auVar110._4_4_ = fVar3 + auVar91._4_4_;
          auVar110._8_4_ = fVar23 + auVar91._8_4_;
          auVar110._12_4_ = fVar12 + auVar91._12_4_;
          auVar110._16_4_ = fVar13 + auVar91._16_4_;
          auVar110._20_4_ = fVar14 + auVar91._20_4_;
          auVar110._24_4_ = fVar15 + auVar91._24_4_;
          auVar110._28_4_ = local_2800._28_4_ + auVar91._28_4_;
          fVar154 = local_28a0._0_4_;
          fVar159 = local_28a0._4_4_;
          auVar35._4_4_ = fVar159 * auVar97._4_4_;
          auVar35._0_4_ = fVar154 * auVar97._0_4_;
          fVar160 = local_28a0._8_4_;
          auVar35._8_4_ = fVar160 * auVar97._8_4_;
          fVar161 = local_28a0._12_4_;
          auVar35._12_4_ = fVar161 * auVar97._12_4_;
          fVar162 = local_28a0._16_4_;
          auVar35._16_4_ = fVar162 * auVar97._16_4_;
          fVar163 = local_28a0._20_4_;
          auVar35._20_4_ = fVar163 * auVar97._20_4_;
          fVar164 = local_28a0._24_4_;
          auVar35._24_4_ = fVar164 * auVar97._24_4_;
          auVar35._28_4_ = fVar113;
          auVar100 = vfmsub231ps_fma(auVar35,local_2880,auVar110);
          auVar27 = vsubps_avx(local_29c0,auVar85);
          fVar113 = auVar27._0_4_;
          fVar119 = auVar27._4_4_;
          auVar36._4_4_ = auVar110._4_4_ * fVar119;
          auVar36._0_4_ = auVar110._0_4_ * fVar113;
          fVar121 = auVar27._8_4_;
          auVar36._8_4_ = auVar110._8_4_ * fVar121;
          fVar123 = auVar27._12_4_;
          auVar36._12_4_ = auVar110._12_4_ * fVar123;
          fVar17 = auVar27._16_4_;
          auVar36._16_4_ = auVar110._16_4_ * fVar17;
          fVar19 = auVar27._20_4_;
          auVar36._20_4_ = auVar110._20_4_ * fVar19;
          fVar21 = auVar27._24_4_;
          auVar36._24_4_ = auVar110._24_4_ * fVar21;
          auVar36._28_4_ = auVar110._28_4_;
          auVar136._0_4_ = local_29c0._0_4_ + auVar85._0_4_;
          auVar136._4_4_ = local_29c0._4_4_ + auVar85._4_4_;
          auVar136._8_4_ = local_29c0._8_4_ + auVar85._8_4_;
          auVar136._12_4_ = local_29c0._12_4_ + auVar85._12_4_;
          auVar136._16_4_ = local_29c0._16_4_ + auVar85._16_4_;
          auVar136._20_4_ = local_29c0._20_4_ + auVar85._20_4_;
          auVar136._24_4_ = local_29c0._24_4_ + auVar85._24_4_;
          auVar136._28_4_ = local_29c0._28_4_ + auVar85._28_4_;
          auVar93 = vfmsub231ps_fma(auVar36,local_28a0,auVar136);
          fVar118 = local_2880._0_4_;
          fVar120 = local_2880._4_4_;
          auVar37._4_4_ = auVar136._4_4_ * fVar120;
          auVar37._0_4_ = auVar136._0_4_ * fVar118;
          fVar122 = local_2880._8_4_;
          auVar37._8_4_ = auVar136._8_4_ * fVar122;
          fVar16 = local_2880._12_4_;
          auVar37._12_4_ = auVar136._12_4_ * fVar16;
          fVar18 = local_2880._16_4_;
          auVar37._16_4_ = auVar136._16_4_ * fVar18;
          fVar20 = local_2880._20_4_;
          auVar37._20_4_ = auVar136._20_4_ * fVar20;
          fVar22 = local_2880._24_4_;
          auVar37._24_4_ = auVar136._24_4_ * fVar22;
          auVar37._28_4_ = auVar136._28_4_;
          auVar83 = vfmsub231ps_fma(auVar37,auVar27,auVar97);
          auVar38._4_4_ = auVar83._4_4_ * fVar1;
          auVar38._0_4_ = auVar83._0_4_ * fVar1;
          auVar38._8_4_ = auVar83._8_4_ * fVar1;
          auVar38._12_4_ = auVar83._12_4_ * fVar1;
          auVar38._16_4_ = fVar1 * 0.0;
          auVar38._20_4_ = fVar1 * 0.0;
          auVar38._24_4_ = fVar1 * 0.0;
          auVar38._28_4_ = auVar97._28_4_;
          auVar93 = vfmadd231ps_fma(auVar38,auVar167,ZEXT1632(auVar93));
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar130,ZEXT1632(auVar100));
          auVar28 = vsubps_avx(auVar85,auVar24);
          auVar105._0_4_ = auVar85._0_4_ + auVar24._0_4_;
          auVar105._4_4_ = auVar85._4_4_ + auVar24._4_4_;
          auVar105._8_4_ = auVar85._8_4_ + auVar24._8_4_;
          auVar105._12_4_ = auVar85._12_4_ + auVar24._12_4_;
          auVar105._16_4_ = auVar85._16_4_ + auVar24._16_4_;
          auVar105._20_4_ = auVar85._20_4_ + auVar24._20_4_;
          auVar105._24_4_ = auVar85._24_4_ + auVar24._24_4_;
          auVar105._28_4_ = auVar85._28_4_ + auVar24._28_4_;
          auVar24 = vsubps_avx(auVar103,auVar25);
          auVar117._0_4_ = auVar103._0_4_ + auVar25._0_4_;
          auVar117._4_4_ = auVar103._4_4_ + auVar25._4_4_;
          auVar117._8_4_ = auVar103._8_4_ + auVar25._8_4_;
          auVar117._12_4_ = auVar103._12_4_ + auVar25._12_4_;
          auVar117._16_4_ = auVar103._16_4_ + auVar25._16_4_;
          auVar117._20_4_ = auVar103._20_4_ + auVar25._20_4_;
          auVar117._24_4_ = auVar103._24_4_ + auVar25._24_4_;
          auVar117._28_4_ = auVar103._28_4_ + auVar25._28_4_;
          auVar25 = vsubps_avx(auVar91,auVar26);
          auVar88._0_4_ = auVar91._0_4_ + auVar26._0_4_;
          auVar88._4_4_ = auVar91._4_4_ + auVar26._4_4_;
          auVar88._8_4_ = auVar91._8_4_ + auVar26._8_4_;
          auVar88._12_4_ = auVar91._12_4_ + auVar26._12_4_;
          auVar88._16_4_ = auVar91._16_4_ + auVar26._16_4_;
          auVar88._20_4_ = auVar91._20_4_ + auVar26._20_4_;
          auVar88._24_4_ = auVar91._24_4_ + auVar26._24_4_;
          auVar88._28_4_ = auVar91._28_4_ + auVar26._28_4_;
          auVar126._0_4_ = auVar25._0_4_ * auVar117._0_4_;
          auVar126._4_4_ = auVar25._4_4_ * auVar117._4_4_;
          auVar126._8_4_ = auVar25._8_4_ * auVar117._8_4_;
          auVar126._12_4_ = auVar25._12_4_ * auVar117._12_4_;
          auVar126._16_4_ = auVar25._16_4_ * auVar117._16_4_;
          auVar126._20_4_ = auVar25._20_4_ * auVar117._20_4_;
          auVar126._24_4_ = auVar25._24_4_ * auVar117._24_4_;
          auVar126._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar126,auVar24,auVar88);
          auVar39._4_4_ = auVar88._4_4_ * auVar28._4_4_;
          auVar39._0_4_ = auVar88._0_4_ * auVar28._0_4_;
          auVar39._8_4_ = auVar88._8_4_ * auVar28._8_4_;
          auVar39._12_4_ = auVar88._12_4_ * auVar28._12_4_;
          auVar39._16_4_ = auVar88._16_4_ * auVar28._16_4_;
          auVar39._20_4_ = auVar88._20_4_ * auVar28._20_4_;
          auVar39._24_4_ = auVar88._24_4_ * auVar28._24_4_;
          auVar39._28_4_ = auVar88._28_4_;
          auVar100 = vfmsub231ps_fma(auVar39,auVar25,auVar105);
          auVar40._4_4_ = auVar24._4_4_ * auVar105._4_4_;
          auVar40._0_4_ = auVar24._0_4_ * auVar105._0_4_;
          auVar40._8_4_ = auVar24._8_4_ * auVar105._8_4_;
          auVar40._12_4_ = auVar24._12_4_ * auVar105._12_4_;
          auVar40._16_4_ = auVar24._16_4_ * auVar105._16_4_;
          auVar40._20_4_ = auVar24._20_4_ * auVar105._20_4_;
          auVar40._24_4_ = auVar24._24_4_ * auVar105._24_4_;
          auVar40._28_4_ = auVar105._28_4_;
          auVar114 = vfmsub231ps_fma(auVar40,auVar28,auVar117);
          auVar106._0_4_ = fVar1 * auVar114._0_4_;
          auVar106._4_4_ = fVar1 * auVar114._4_4_;
          auVar106._8_4_ = fVar1 * auVar114._8_4_;
          auVar106._12_4_ = fVar1 * auVar114._12_4_;
          auVar106._16_4_ = fVar1 * 0.0;
          auVar106._20_4_ = fVar1 * 0.0;
          auVar106._24_4_ = fVar1 * 0.0;
          auVar106._28_4_ = 0;
          auVar100 = vfmadd231ps_fma(auVar106,auVar167,ZEXT1632(auVar100));
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar130,ZEXT1632(auVar83));
          local_26a0 = ZEXT1632(CONCAT412(auVar100._12_4_ + auVar82._12_4_ + auVar93._12_4_,
                                          CONCAT48(auVar100._8_4_ + auVar82._8_4_ + auVar93._8_4_,
                                                   CONCAT44(auVar100._4_4_ +
                                                            auVar82._4_4_ + auVar93._4_4_,
                                                            auVar100._0_4_ +
                                                            auVar82._0_4_ + auVar93._0_4_))));
          auVar89._8_4_ = 0x7fffffff;
          auVar89._0_8_ = 0x7fffffff7fffffff;
          auVar89._12_4_ = 0x7fffffff;
          auVar89._16_4_ = 0x7fffffff;
          auVar89._20_4_ = 0x7fffffff;
          auVar89._24_4_ = 0x7fffffff;
          auVar89._28_4_ = 0x7fffffff;
          local_28e0 = ZEXT1632(auVar82);
          auVar85 = vminps_avx(local_28e0,ZEXT1632(auVar93));
          auVar85 = vminps_avx(auVar85,ZEXT1632(auVar100));
          local_2900 = vandps_avx(local_26a0,auVar89);
          fVar132 = local_2900._0_4_ * 1.1920929e-07;
          fVar138 = local_2900._4_4_ * 1.1920929e-07;
          auVar41._4_4_ = fVar138;
          auVar41._0_4_ = fVar132;
          fVar139 = local_2900._8_4_ * 1.1920929e-07;
          auVar41._8_4_ = fVar139;
          fVar140 = local_2900._12_4_ * 1.1920929e-07;
          auVar41._12_4_ = fVar140;
          fVar141 = local_2900._16_4_ * 1.1920929e-07;
          auVar41._16_4_ = fVar141;
          fVar142 = local_2900._20_4_ * 1.1920929e-07;
          auVar41._20_4_ = fVar142;
          fVar143 = local_2900._24_4_ * 1.1920929e-07;
          auVar41._24_4_ = fVar143;
          auVar41._28_4_ = 0x34000000;
          auVar127._0_8_ = CONCAT44(fVar138,fVar132) ^ 0x8000000080000000;
          auVar127._8_4_ = -fVar139;
          auVar127._12_4_ = -fVar140;
          auVar127._16_4_ = -fVar141;
          auVar127._20_4_ = -fVar142;
          auVar127._24_4_ = -fVar143;
          auVar127._28_4_ = 0xb4000000;
          auVar85 = vcmpps_avx(auVar85,auVar127,5);
          auVar91 = vmaxps_avx(local_28e0,ZEXT1632(auVar93));
          auVar103 = vmaxps_avx(auVar91,ZEXT1632(auVar100));
          auVar103 = vcmpps_avx(auVar103,auVar41,2);
          auVar103 = vorps_avx(auVar85,auVar103);
          if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar103 >> 0x7f,0) != '\0') ||
                (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar103 >> 0xbf,0) != '\0') ||
              (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar103[0x1f] < '\0') {
            auVar42._4_4_ = fVar120 * local_2840._4_4_;
            auVar42._0_4_ = fVar118 * local_2840._0_4_;
            auVar42._8_4_ = fVar122 * local_2840._8_4_;
            auVar42._12_4_ = fVar16 * local_2840._12_4_;
            auVar42._16_4_ = fVar18 * local_2840._16_4_;
            auVar42._20_4_ = fVar20 * local_2840._20_4_;
            auVar42._24_4_ = fVar22 * local_2840._24_4_;
            auVar42._28_4_ = auVar85._28_4_;
            local_28c0 = fVar113 * local_2860._0_4_;
            fStack_28bc = fVar119 * local_2860._4_4_;
            fStack_28b8 = fVar121 * local_2860._8_4_;
            fStack_28b4 = fVar123 * local_2860._12_4_;
            fStack_28b0 = fVar17 * local_2860._16_4_;
            fStack_28ac = fVar19 * local_2860._20_4_;
            uStack_28a4 = auVar91._28_4_;
            fStack_28a8 = fVar21 * local_2860._24_4_;
            auVar100 = vfmsub213ps_fma(local_2860,local_28a0,auVar42);
            auVar43._4_4_ = auVar24._4_4_ * fVar159;
            auVar43._0_4_ = auVar24._0_4_ * fVar154;
            auVar43._8_4_ = auVar24._8_4_ * fVar160;
            auVar43._12_4_ = auVar24._12_4_ * fVar161;
            auVar43._16_4_ = auVar24._16_4_ * fVar162;
            auVar43._20_4_ = auVar24._20_4_ * fVar163;
            auVar43._24_4_ = auVar24._24_4_ * fVar164;
            auVar43._28_4_ = uStack_28a4;
            auVar44._4_4_ = auVar25._4_4_ * fVar119;
            auVar44._0_4_ = auVar25._0_4_ * fVar113;
            auVar44._8_4_ = auVar25._8_4_ * fVar121;
            auVar44._12_4_ = auVar25._12_4_ * fVar123;
            auVar44._16_4_ = auVar25._16_4_ * fVar17;
            auVar44._20_4_ = auVar25._20_4_ * fVar19;
            auVar44._24_4_ = auVar25._24_4_ * fVar21;
            auVar44._28_4_ = local_2900._28_4_;
            auVar83 = vfmsub213ps_fma(auVar25,local_2880,auVar43);
            auVar85 = vandps_avx(auVar42,auVar89);
            auVar91 = vandps_avx(auVar43,auVar89);
            auVar85 = vcmpps_avx(auVar85,auVar91,1);
            local_2680 = vblendvps_avx(ZEXT1632(auVar83),ZEXT1632(auVar100),auVar85);
            auVar45._4_4_ = fVar120 * auVar28._4_4_;
            auVar45._0_4_ = fVar118 * auVar28._0_4_;
            auVar45._8_4_ = fVar122 * auVar28._8_4_;
            auVar45._12_4_ = fVar16 * auVar28._12_4_;
            auVar45._16_4_ = fVar18 * auVar28._16_4_;
            auVar45._20_4_ = fVar20 * auVar28._20_4_;
            auVar45._24_4_ = fVar22 * auVar28._24_4_;
            auVar45._28_4_ = auVar85._28_4_;
            auVar100 = vfmsub213ps_fma(auVar28,local_28a0,auVar44);
            auVar46._4_4_ = local_2820._4_4_ * fVar159;
            auVar46._0_4_ = local_2820._0_4_ * fVar154;
            auVar46._8_4_ = local_2820._8_4_ * fVar160;
            auVar46._12_4_ = local_2820._12_4_ * fVar161;
            auVar46._16_4_ = local_2820._16_4_ * fVar162;
            auVar46._20_4_ = local_2820._20_4_ * fVar163;
            auVar46._24_4_ = local_2820._24_4_ * fVar164;
            auVar46._28_4_ = auVar91._28_4_;
            auVar83 = vfmsub213ps_fma(local_2840,auVar27,auVar46);
            auVar85 = vandps_avx(auVar46,auVar89);
            auVar91 = vandps_avx(auVar44,auVar89);
            auVar85 = vcmpps_avx(auVar85,auVar91,1);
            local_2660 = vblendvps_avx(ZEXT1632(auVar100),ZEXT1632(auVar83),auVar85);
            auVar49._4_4_ = fStack_28bc;
            auVar49._0_4_ = local_28c0;
            auVar49._8_4_ = fStack_28b8;
            auVar49._12_4_ = fStack_28b4;
            auVar49._16_4_ = fStack_28b0;
            auVar49._20_4_ = fStack_28ac;
            auVar49._24_4_ = fStack_28a8;
            auVar49._28_4_ = uStack_28a4;
            auVar100 = vfmsub213ps_fma(local_2820,local_2880,auVar49);
            auVar83 = vfmsub213ps_fma(auVar24,auVar27,auVar45);
            auVar85 = vandps_avx(auVar49,auVar89);
            auVar91 = vandps_avx(auVar45,auVar89);
            auVar91 = vcmpps_avx(auVar85,auVar91,1);
            local_2640 = vblendvps_avx(ZEXT1632(auVar83),ZEXT1632(auVar100),auVar91);
            auVar100 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
            fVar113 = local_2640._0_4_;
            auVar90._0_4_ = fVar113 * fVar1;
            fVar118 = local_2640._4_4_;
            auVar90._4_4_ = fVar118 * fVar1;
            fVar119 = local_2640._8_4_;
            auVar90._8_4_ = fVar119 * fVar1;
            fVar120 = local_2640._12_4_;
            auVar90._12_4_ = fVar120 * fVar1;
            fVar121 = local_2640._16_4_;
            auVar90._16_4_ = fVar121 * fVar1;
            fVar122 = local_2640._20_4_;
            auVar90._20_4_ = fVar122 * fVar1;
            fVar123 = local_2640._24_4_;
            auVar90._24_4_ = fVar123 * fVar1;
            auVar90._28_4_ = 0;
            auVar83 = vfmadd213ps_fma(auVar167,local_2660,auVar90);
            auVar83 = vfmadd213ps_fma(auVar130,local_2680,ZEXT1632(auVar83));
            auVar91 = ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                         CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                  CONCAT44(auVar83._4_4_ + auVar83._4_4_,
                                                           auVar83._0_4_ + auVar83._0_4_))));
            auVar47._4_4_ = fVar118 * fVar3;
            auVar47._0_4_ = fVar113 * fVar2;
            auVar47._8_4_ = fVar119 * fVar23;
            auVar47._12_4_ = fVar120 * fVar12;
            auVar47._16_4_ = fVar121 * fVar13;
            auVar47._20_4_ = fVar122 * fVar14;
            auVar47._24_4_ = fVar123 * fVar15;
            auVar47._28_4_ = auVar85._28_4_;
            auVar83 = vfmadd213ps_fma(local_2960,local_2660,auVar47);
            auVar114 = vfmadd213ps_fma(local_29c0,local_2680,ZEXT1632(auVar83));
            auVar85 = vrcpps_avx(auVar91);
            auVar149._8_4_ = 0x3f800000;
            auVar149._0_8_ = 0x3f8000003f800000;
            auVar149._12_4_ = 0x3f800000;
            auVar149._16_4_ = 0x3f800000;
            auVar149._20_4_ = 0x3f800000;
            auVar149._24_4_ = 0x3f800000;
            auVar149._28_4_ = 0x3f800000;
            auVar83 = vfnmadd213ps_fma(auVar85,auVar91,auVar149);
            auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar85,auVar85);
            local_25c0._28_4_ = 0x3f800000;
            local_25c0._0_28_ =
                 ZEXT1628(CONCAT412(auVar83._12_4_ * (auVar114._12_4_ + auVar114._12_4_),
                                    CONCAT48(auVar83._8_4_ * (auVar114._8_4_ + auVar114._8_4_),
                                             CONCAT44(auVar83._4_4_ *
                                                      (auVar114._4_4_ + auVar114._4_4_),
                                                      auVar83._0_4_ *
                                                      (auVar114._0_4_ + auVar114._0_4_)))));
            auVar128 = ZEXT3264(local_25c0);
            uVar155 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar111._4_4_ = uVar155;
            auVar111._0_4_ = uVar155;
            auVar111._8_4_ = uVar155;
            auVar111._12_4_ = uVar155;
            auVar111._16_4_ = uVar155;
            auVar111._20_4_ = uVar155;
            auVar111._24_4_ = uVar155;
            auVar111._28_4_ = uVar155;
            uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar157._4_4_ = uVar155;
            auVar157._0_4_ = uVar155;
            auVar157._8_4_ = uVar155;
            auVar157._12_4_ = uVar155;
            auVar157._16_4_ = uVar155;
            auVar157._20_4_ = uVar155;
            auVar157._24_4_ = uVar155;
            auVar157._28_4_ = uVar155;
            auVar131 = ZEXT3264(auVar157);
            auVar85 = vcmpps_avx(auVar111,local_25c0,2);
            auVar103 = vcmpps_avx(local_25c0,auVar157,2);
            auVar85 = vandps_avx(auVar103,auVar85);
            auVar83 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
            auVar100 = vpand_avx(auVar83,auVar100);
            auVar85 = vpmovsxwd_avx2(auVar100);
            if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar85 >> 0x7f,0) != '\0') ||
                  (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar85 >> 0xbf,0) != '\0') ||
                (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar85[0x1f] < '\0') {
              auVar85 = vcmpps_avx(auVar91,_DAT_01faff00,4);
              auVar83 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
              auVar100 = vpand_avx(auVar100,auVar83);
              local_2940 = vpmovsxwd_avx2(auVar100);
              if ((((((((local_2940 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_2940 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_2940 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_2940 >> 0x7f,0) != '\0') ||
                    (local_2940 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_2940 >> 0xbf,0) != '\0') ||
                  (local_2940 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_2940[0x1f] < '\0') {
                local_26e0 = ZEXT1632(auVar82);
                local_26c0 = ZEXT1632(auVar93);
                local_2620 = local_2940;
                local_2540 = local_23e0;
                auVar85 = vrcpps_avx(local_26a0);
                auVar146._8_4_ = 0x3f800000;
                auVar146._0_8_ = 0x3f8000003f800000;
                auVar146._12_4_ = 0x3f800000;
                auVar146._16_4_ = 0x3f800000;
                auVar146._20_4_ = 0x3f800000;
                auVar146._24_4_ = 0x3f800000;
                auVar146._28_4_ = 0x3f800000;
                auVar83 = vfnmadd213ps_fma(local_26a0,auVar85,auVar146);
                auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar85,auVar85);
                auVar112._8_4_ = 0x219392ef;
                auVar112._0_8_ = 0x219392ef219392ef;
                auVar112._12_4_ = 0x219392ef;
                auVar112._16_4_ = 0x219392ef;
                auVar112._20_4_ = 0x219392ef;
                auVar112._24_4_ = 0x219392ef;
                auVar112._28_4_ = 0x219392ef;
                auVar85 = vcmpps_avx(local_2900,auVar112,5);
                auVar85 = vandps_avx(auVar85,ZEXT1632(auVar83));
                auVar48._4_4_ = auVar82._4_4_ * auVar85._4_4_;
                auVar48._0_4_ = auVar82._0_4_ * auVar85._0_4_;
                auVar48._8_4_ = auVar82._8_4_ * auVar85._8_4_;
                auVar48._12_4_ = auVar82._12_4_ * auVar85._12_4_;
                auVar48._16_4_ = auVar85._16_4_ * 0.0;
                auVar48._20_4_ = auVar85._20_4_ * 0.0;
                auVar48._24_4_ = auVar85._24_4_ * 0.0;
                auVar48._28_4_ = 0;
                auVar103 = vminps_avx(auVar48,auVar146);
                auVar98._0_4_ = auVar93._0_4_ * auVar85._0_4_;
                auVar98._4_4_ = auVar93._4_4_ * auVar85._4_4_;
                auVar98._8_4_ = auVar93._8_4_ * auVar85._8_4_;
                auVar98._12_4_ = auVar93._12_4_ * auVar85._12_4_;
                auVar98._16_4_ = auVar85._16_4_ * 0.0;
                auVar98._20_4_ = auVar85._20_4_ * 0.0;
                auVar98._24_4_ = auVar85._24_4_ * 0.0;
                auVar98._28_4_ = 0;
                auVar85 = vminps_avx(auVar98,auVar146);
                auVar91 = vsubps_avx(auVar146,auVar103);
                auVar24 = vsubps_avx(auVar146,auVar85);
                local_25e0 = vblendvps_avx(auVar85,auVar91,local_23e0);
                local_2600 = vblendvps_avx(auVar103,auVar24,local_23e0);
                local_25a0[0] = local_2680._0_4_ * (float)local_2400._0_4_;
                local_25a0[1] = local_2680._4_4_ * (float)local_2400._4_4_;
                local_25a0[2] = local_2680._8_4_ * fStack_23f8;
                local_25a0[3] = local_2680._12_4_ * fStack_23f4;
                fStack_2590 = local_2680._16_4_ * fStack_23f0;
                fStack_258c = local_2680._20_4_ * fStack_23ec;
                fStack_2588 = local_2680._24_4_ * fStack_23e8;
                uStack_2584 = local_2600._28_4_;
                local_2580[0] = (float)local_2400._0_4_ * local_2660._0_4_;
                local_2580[1] = (float)local_2400._4_4_ * local_2660._4_4_;
                local_2580[2] = fStack_23f8 * local_2660._8_4_;
                local_2580[3] = fStack_23f4 * local_2660._12_4_;
                fStack_2570 = fStack_23f0 * local_2660._16_4_;
                fStack_256c = fStack_23ec * local_2660._20_4_;
                fStack_2568 = fStack_23e8 * local_2660._24_4_;
                uStack_2564 = local_25e0._28_4_;
                local_2560[0] = (float)local_2400._0_4_ * fVar113;
                local_2560[1] = (float)local_2400._4_4_ * fVar118;
                local_2560[2] = fStack_23f8 * fVar119;
                local_2560[3] = fStack_23f4 * fVar120;
                fStack_2550 = fStack_23f0 * fVar121;
                fStack_254c = fStack_23ec * fVar122;
                fStack_2548 = fStack_23e8 * fVar123;
                uStack_2544 = uStack_23e4;
                auVar85 = vpmovsxwd_avx2(auVar100);
                auVar99._8_4_ = 0x7f800000;
                auVar99._0_8_ = 0x7f8000007f800000;
                auVar99._12_4_ = 0x7f800000;
                auVar99._16_4_ = 0x7f800000;
                auVar99._20_4_ = 0x7f800000;
                auVar99._24_4_ = 0x7f800000;
                auVar99._28_4_ = 0x7f800000;
                auVar85 = vblendvps_avx(auVar99,local_25c0,auVar85);
                auVar103 = vshufps_avx(auVar85,auVar85,0xb1);
                auVar103 = vminps_avx(auVar85,auVar103);
                auVar91 = vshufpd_avx(auVar103,auVar103,5);
                auVar103 = vminps_avx(auVar103,auVar91);
                auVar91 = vpermpd_avx2(auVar103,0x4e);
                auVar103 = vminps_avx(auVar103,auVar91);
                auVar85 = vcmpps_avx(auVar85,auVar103,0);
                auVar82 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
                auVar82 = vpand_avx(auVar82,auVar100);
                auVar85 = vpmovsxwd_avx2(auVar82);
                if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar85 >> 0x7f,0) == '\0') &&
                      (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar85 >> 0xbf,0) == '\0') &&
                    (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar85[0x1f]) {
                  auVar85 = local_2940;
                }
                auVar137 = ZEXT3264(auVar85);
LAB_005ed030:
                uVar50 = vmovmskps_avx(auVar137._0_32_);
                uVar57 = 0;
                for (; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x80000000) {
                  uVar57 = uVar57 + 1;
                }
                uVar54 = CONCAT44(0,uVar57);
                local_2710 = *(uint *)((long)&local_23c0 + uVar54 * 4);
                pGVar69 = (pSVar7->geometries).items[local_2710].ptr;
                if ((pGVar69->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2940 + uVar54 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar69->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar54 = (ulong)(uVar57 << 2);
                    uVar155 = *(undefined4 *)(local_2600 + uVar54);
                    uVar4 = *(undefined4 *)(local_25e0 + uVar54);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar54);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_25a0 + uVar54)
                    ;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_2580 + uVar54)
                    ;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_2560 + uVar54)
                    ;
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar155;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_27a0 + uVar54);
                    *(uint *)(ray + k * 4 + 0x120) = local_2710;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_005ed485;
                  }
                  uVar58 = (ulong)(uVar57 * 4);
                  uVar155 = *(undefined4 *)(local_2600 + uVar58);
                  local_2740._4_4_ = uVar155;
                  local_2740._0_4_ = uVar155;
                  local_2740._8_4_ = uVar155;
                  local_2740._12_4_ = uVar155;
                  local_2730 = *(undefined4 *)(local_25e0 + uVar58);
                  uVar155 = *(undefined4 *)((long)&local_27a0 + uVar58);
                  auVar102._4_4_ = uVar155;
                  auVar102._0_4_ = uVar155;
                  auVar102._8_4_ = uVar155;
                  auVar102._12_4_ = uVar155;
                  uVar155 = *(undefined4 *)((long)local_25a0 + uVar58);
                  uVar4 = *(undefined4 *)((long)local_2580 + uVar58);
                  local_2760._4_4_ = uVar4;
                  local_2760._0_4_ = uVar4;
                  local_2760._8_4_ = uVar4;
                  local_2760._12_4_ = uVar4;
                  uVar4 = *(undefined4 *)((long)local_2560 + uVar58);
                  local_2750._4_4_ = uVar4;
                  local_2750._0_4_ = uVar4;
                  local_2750._8_4_ = uVar4;
                  local_2750._12_4_ = uVar4;
                  local_2770[0] = (RTCHitN)(char)uVar155;
                  local_2770[1] = (RTCHitN)(char)((uint)uVar155 >> 8);
                  local_2770[2] = (RTCHitN)(char)((uint)uVar155 >> 0x10);
                  local_2770[3] = (RTCHitN)(char)((uint)uVar155 >> 0x18);
                  local_2770[4] = (RTCHitN)(char)uVar155;
                  local_2770[5] = (RTCHitN)(char)((uint)uVar155 >> 8);
                  local_2770[6] = (RTCHitN)(char)((uint)uVar155 >> 0x10);
                  local_2770[7] = (RTCHitN)(char)((uint)uVar155 >> 0x18);
                  local_2770[8] = (RTCHitN)(char)uVar155;
                  local_2770[9] = (RTCHitN)(char)((uint)uVar155 >> 8);
                  local_2770[10] = (RTCHitN)(char)((uint)uVar155 >> 0x10);
                  local_2770[0xb] = (RTCHitN)(char)((uint)uVar155 >> 0x18);
                  local_2770[0xc] = (RTCHitN)(char)uVar155;
                  local_2770[0xd] = (RTCHitN)(char)((uint)uVar155 >> 8);
                  local_2770[0xe] = (RTCHitN)(char)((uint)uVar155 >> 0x10);
                  local_2770[0xf] = (RTCHitN)(char)((uint)uVar155 >> 0x18);
                  uStack_272c = local_2730;
                  uStack_2728 = local_2730;
                  uStack_2724 = local_2730;
                  local_2720 = auVar102;
                  uStack_270c = local_2710;
                  uStack_2708 = local_2710;
                  uStack_2704 = local_2710;
                  vpcmpeqd_avx2(ZEXT1632(local_2740),ZEXT1632(local_2740));
                  uStack_26fc = context->user->instID[0];
                  local_2700 = uStack_26fc;
                  uStack_26f8 = uStack_26fc;
                  uStack_26f4 = uStack_26fc;
                  uStack_26f0 = context->user->instPrimID[0];
                  uStack_26ec = uStack_26f0;
                  uStack_26e8 = uStack_26f0;
                  uStack_26e4 = uStack_26f0;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar58);
                  local_2a20 = *local_2a10;
                  local_2990.valid = (int *)local_2a20;
                  local_2990.geometryUserPtr = pGVar69->userPtr;
                  local_2990.context = context->user;
                  local_2990.hit = local_2770;
                  local_2990.N = 4;
                  auVar85 = auVar128._0_32_;
                  auVar103 = auVar131._0_32_;
                  local_29c0._0_8_ = uVar54;
                  local_2990.ray = (RTCRayN *)ray;
                  if (pGVar69->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_2960._0_8_ = pGVar69;
                    (*pGVar69->intersectionFilterN)(&local_2990);
                    auVar131 = ZEXT3264(auVar103);
                    auVar128 = ZEXT3264(auVar85);
                    uVar54 = local_29c0._0_8_;
                    pGVar69 = (Geometry *)local_2960._0_8_;
                  }
                  if (local_2a20 == (undefined1  [16])0x0) {
                    auVar82 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar82 = auVar82 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar69->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_2990);
                      auVar131 = ZEXT3264(auVar103);
                      auVar128 = ZEXT3264(auVar85);
                      uVar54 = local_29c0._0_8_;
                    }
                    auVar93 = vpcmpeqd_avx(local_2a20,_DAT_01f7aa10);
                    auVar100 = vpcmpeqd_avx(auVar102,auVar102);
                    auVar82 = auVar93 ^ auVar100;
                    if (local_2a20 != (undefined1  [16])0x0) {
                      auVar93 = auVar93 ^ auVar100;
                      auVar100 = vmaskmovps_avx(auVar93,*(undefined1 (*) [16])local_2990.hit);
                      *(undefined1 (*) [16])(local_2990.ray + 0xc0) = auVar100;
                      auVar100 = vmaskmovps_avx(auVar93,*(undefined1 (*) [16])
                                                         (local_2990.hit + 0x10));
                      *(undefined1 (*) [16])(local_2990.ray + 0xd0) = auVar100;
                      auVar100 = vmaskmovps_avx(auVar93,*(undefined1 (*) [16])
                                                         (local_2990.hit + 0x20));
                      *(undefined1 (*) [16])(local_2990.ray + 0xe0) = auVar100;
                      auVar100 = vmaskmovps_avx(auVar93,*(undefined1 (*) [16])
                                                         (local_2990.hit + 0x30));
                      *(undefined1 (*) [16])(local_2990.ray + 0xf0) = auVar100;
                      auVar100 = vmaskmovps_avx(auVar93,*(undefined1 (*) [16])
                                                         (local_2990.hit + 0x40));
                      *(undefined1 (*) [16])(local_2990.ray + 0x100) = auVar100;
                      auVar100 = vmaskmovps_avx(auVar93,*(undefined1 (*) [16])
                                                         (local_2990.hit + 0x50));
                      *(undefined1 (*) [16])(local_2990.ray + 0x110) = auVar100;
                      auVar100 = vmaskmovps_avx(auVar93,*(undefined1 (*) [16])
                                                         (local_2990.hit + 0x60));
                      *(undefined1 (*) [16])(local_2990.ray + 0x120) = auVar100;
                      auVar100 = vmaskmovps_avx(auVar93,*(undefined1 (*) [16])
                                                         (local_2990.hit + 0x70));
                      *(undefined1 (*) [16])(local_2990.ray + 0x130) = auVar100;
                      auVar93 = vmaskmovps_avx(auVar93,*(undefined1 (*) [16])(local_2990.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_2990.ray + 0x140) = auVar93;
                    }
                  }
                  auVar77._8_8_ = 0x100000001;
                  auVar77._0_8_ = 0x100000001;
                  if ((auVar77 & auVar82) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar131._0_4_;
                  }
                  else {
                    auVar131 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_2940 + uVar54 * 4) = 0;
                  uVar155 = auVar131._0_4_;
                  auVar80._4_4_ = uVar155;
                  auVar80._0_4_ = uVar155;
                  auVar80._8_4_ = uVar155;
                  auVar80._12_4_ = uVar155;
                  auVar80._16_4_ = uVar155;
                  auVar80._20_4_ = uVar155;
                  auVar80._24_4_ = uVar155;
                  auVar80._28_4_ = uVar155;
                  auVar85 = vcmpps_avx(auVar128._0_32_,auVar80,2);
                  local_2940 = vandps_avx(auVar85,local_2940);
                }
                auVar137 = ZEXT3264(local_2940);
                if ((((((((local_2940 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_2940 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_2940 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_2940 >> 0x7f,0) == '\0') &&
                      (local_2940 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_2940 >> 0xbf,0) == '\0') &&
                    (local_2940 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_2940[0x1f]) goto LAB_005ed485;
                auVar92._8_4_ = 0x7f800000;
                auVar92._0_8_ = 0x7f8000007f800000;
                auVar92._12_4_ = 0x7f800000;
                auVar92._16_4_ = 0x7f800000;
                auVar92._20_4_ = 0x7f800000;
                auVar92._24_4_ = 0x7f800000;
                auVar92._28_4_ = 0x7f800000;
                auVar85 = vblendvps_avx(auVar92,auVar128._0_32_,local_2940);
                auVar103 = vshufps_avx(auVar85,auVar85,0xb1);
                auVar103 = vminps_avx(auVar85,auVar103);
                auVar91 = vshufpd_avx(auVar103,auVar103,5);
                auVar103 = vminps_avx(auVar103,auVar91);
                auVar91 = vpermpd_avx2(auVar103,0x4e);
                auVar103 = vminps_avx(auVar103,auVar91);
                auVar85 = vcmpps_avx(auVar85,auVar103,0);
                auVar103 = local_2940 & auVar85;
                if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar103 >> 0x7f,0) != '\0') ||
                      (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar103 >> 0xbf,0) != '\0') ||
                    (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar103[0x1f] < '\0') {
                  auVar85 = vandps_avx(auVar85,local_2940);
                  auVar137 = ZEXT3264(auVar85);
                }
                goto LAB_005ed030;
              }
            }
          }
LAB_005ed485:
          local_29d8 = local_29d8 + 1;
        } while (local_29d8 != local_2a08);
      }
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar81 = ZEXT3264(CONCAT428(uVar155,CONCAT424(uVar155,CONCAT420(uVar155,CONCAT416(uVar155,
                                                  CONCAT412(uVar155,CONCAT48(uVar155,CONCAT44(
                                                  uVar155,uVar155))))))));
      auVar128 = ZEXT3264(local_2420);
      auVar131 = ZEXT3264(local_2440);
      auVar137 = ZEXT3264(local_2460);
      auVar147 = ZEXT3264(local_2480);
      auVar150 = ZEXT3264(local_24a0);
      auVar152 = ZEXT3264(local_24c0);
      auVar153 = ZEXT3264(local_24e0);
      auVar158 = ZEXT3264(local_2500);
      auVar168 = ZEXT3264(local_2520);
      auVar171 = ZEXT3264(local_2920);
    }
    if (pauVar51 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }